

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall kj::Vector<unsigned_int>::setCapacity(Vector<unsigned_int> *this,size_t newSize)

{
  ArrayDisposer *pAVar1;
  ArrayBuilder<unsigned_int> *pAVar2;
  __off_t __length;
  undefined1 local_38 [8];
  ArrayBuilder<unsigned_int> newBuilder;
  size_t newSize_local;
  Vector<unsigned_int> *this_local;
  
  newBuilder.disposer = (ArrayDisposer *)newSize;
  pAVar1 = (ArrayDisposer *)ArrayBuilder<unsigned_int>::size(&this->builder);
  if (newBuilder.disposer < pAVar1) {
    ArrayBuilder<unsigned_int>::truncate(&this->builder,(char *)newBuilder.disposer,__length);
  }
  heapArrayBuilder<unsigned_int>((ArrayBuilder<unsigned_int> *)local_38,(size_t)newBuilder.disposer)
  ;
  pAVar2 = mv<kj::ArrayBuilder<unsigned_int>>(&this->builder);
  ArrayBuilder<unsigned_int>::addAll<kj::ArrayBuilder<unsigned_int>>
            ((ArrayBuilder<unsigned_int> *)local_38,pAVar2);
  pAVar2 = mv<kj::ArrayBuilder<unsigned_int>>((ArrayBuilder<unsigned_int> *)local_38);
  ArrayBuilder<unsigned_int>::operator=(&this->builder,pAVar2);
  ArrayBuilder<unsigned_int>::~ArrayBuilder((ArrayBuilder<unsigned_int> *)local_38);
  return;
}

Assistant:

void setCapacity(size_t newSize) {
    if (builder.size() > newSize) {
      builder.truncate(newSize);
    }
    ArrayBuilder<T> newBuilder = heapArrayBuilder<T>(newSize);
    newBuilder.addAll(kj::mv(builder));
    builder = kj::mv(newBuilder);
  }